

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchClass.c
# Opt level: O2

void Dch_ClassesCheck(Dch_Cla_t *p)

{
  Aig_Obj_t **ppAVar1;
  Aig_Obj_t *pAVar2;
  Aig_Man_t *pAVar3;
  uint uVar4;
  uint uVar5;
  void *pvVar6;
  Aig_Obj_t *pAVar7;
  ulong uVar8;
  Aig_Obj_t *pAVar9;
  Aig_Obj_t *pAVar10;
  Vec_Ptr_t *p_00;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  int i;
  int iVar14;
  int local_3c;
  
  p_00 = p->pAig->vObjs;
  uVar5 = p_00->nSize;
  uVar8 = 0;
  if (0 < (int)uVar5) {
    uVar8 = (ulong)uVar5;
  }
  iVar14 = 0;
  local_3c = 0;
  for (uVar11 = 0; uVar11 != uVar8; uVar11 = uVar11 + 1) {
    ppAVar1 = p->pId2Class[uVar11];
    if (ppAVar1 != (Aig_Obj_t **)0x0) {
      pAVar7 = *ppAVar1;
      iVar12 = pAVar7->Id;
      uVar4 = p->pClassSizes[iVar12];
      if (p->pClassSizes[iVar12] < 1) {
        uVar4 = 0;
      }
      pAVar9 = (Aig_Obj_t *)0x0;
      for (uVar13 = 0; uVar4 != uVar13; uVar13 = uVar13 + 1) {
        pAVar2 = p->pId2Class[iVar12][uVar13];
        if (pAVar2 != (Aig_Obj_t *)0x0) {
          ppAVar1 = p->pAig->pReprs;
          if (uVar13 == 0) {
            pAVar9 = pAVar2;
            if ((ppAVar1 != (Aig_Obj_t **)0x0) && (ppAVar1[pAVar2->Id] != (Aig_Obj_t *)0x0)) {
              __assert_fail("Aig_ObjRepr(p->pAig, pObj) == NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchClass.c"
                            ,0xfc,"void Dch_ClassesCheck(Dch_Cla_t *)");
            }
          }
          else {
            if (ppAVar1 == (Aig_Obj_t **)0x0) {
              pAVar10 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar10 = ppAVar1[pAVar2->Id];
            }
            if (pAVar10 != pAVar7) {
              __assert_fail("Aig_ObjRepr(p->pAig, pObj) == ppClass[0]",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchClass.c"
                            ,0xff,"void Dch_ClassesCheck(Dch_Cla_t *)");
            }
            if (pAVar2->Id <= pAVar9->Id) {
              __assert_fail("pPrev->Id < pObj->Id",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchClass.c"
                            ,0x100,"void Dch_ClassesCheck(Dch_Cla_t *)");
            }
            iVar14 = iVar14 + 1;
            pAVar9 = pAVar2;
          }
        }
      }
      local_3c = local_3c + 1;
    }
  }
  iVar12 = 0;
  for (i = 0; i < (int)uVar5; i = i + 1) {
    pvVar6 = Vec_PtrEntry(p_00,i);
    pAVar3 = p->pAig;
    if (pvVar6 != (void *)0x0) {
      if (pAVar3->pReprs == (Aig_Obj_t **)0x0) {
        pAVar7 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar7 = pAVar3->pReprs[*(int *)((long)pvVar6 + 0x24)];
      }
      iVar12 = iVar12 + (uint)(pAVar7 == pAVar3->pConst1);
    }
    p_00 = pAVar3->vObjs;
    uVar5 = p_00->nSize;
  }
  if (p->nLits != iVar14) {
    __assert_fail("p->nLits == nLits",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchClass.c"
                  ,0x10a,"void Dch_ClassesCheck(Dch_Cla_t *)");
  }
  if (p->nCands1 != iVar12) {
    __assert_fail("p->nCands1 == nCands1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchClass.c"
                  ,0x10b,"void Dch_ClassesCheck(Dch_Cla_t *)");
  }
  if (p->nClasses != local_3c) {
    __assert_fail("p->nClasses == nClasses",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchClass.c"
                  ,0x10c,"void Dch_ClassesCheck(Dch_Cla_t *)");
  }
  return;
}

Assistant:

void Dch_ClassesCheck( Dch_Cla_t * p )
{
    Aig_Obj_t * pObj, * pPrev, ** ppClass;
    int i, k, nLits, nClasses, nCands1;
    nClasses = nLits = 0;
    Dch_ManForEachClass( p, ppClass, k )
    {
        pPrev = NULL;
        Dch_ClassForEachNode( p, ppClass[0], pObj, i )
        {
            if ( i == 0 )
                assert( Aig_ObjRepr(p->pAig, pObj) == NULL );
            else
            {
                assert( Aig_ObjRepr(p->pAig, pObj) == ppClass[0] );
                assert( pPrev->Id < pObj->Id );
                nLits++;
            }
            pPrev = pObj;
        }
        nClasses++;
    }
    nCands1 = 0;
    Aig_ManForEachObj( p->pAig, pObj, i )
        nCands1 += Dch_ObjIsConst1Cand( p->pAig, pObj );
    assert( p->nLits == nLits );
    assert( p->nCands1 == nCands1 );
    assert( p->nClasses == nClasses );
}